

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int av1_get_max_num_workers(AV1_COMP *cpi)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar5 = 0;
  uVar2 = 0;
  uVar7 = 0;
  uVar4 = 0;
  lVar3 = 0;
  do {
    piVar1 = (cpi->ppi->p_mt_info).num_mod_workers + lVar3;
    uVar6 = -(uint)((int)uVar5 < *piVar1);
    uVar8 = -(uint)((int)uVar2 < piVar1[1]);
    uVar9 = -(uint)((int)uVar7 < piVar1[2]);
    uVar10 = -(uint)((int)uVar4 < piVar1[3]);
    uVar5 = ~uVar6 & uVar5 | *piVar1 & uVar6;
    uVar2 = ~uVar8 & uVar2 | piVar1[1] & uVar8;
    uVar7 = ~uVar9 & uVar7 | piVar1[2] & uVar9;
    uVar4 = ~uVar10 & uVar4 | piVar1[3] & uVar10;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  uVar7 = ~-(uint)((int)uVar7 < (int)uVar5) & uVar7 | uVar5 & -(uint)((int)uVar7 < (int)uVar5);
  uVar2 = ~-(uint)((int)uVar4 < (int)uVar2) & uVar4 | uVar2 & -(uint)((int)uVar4 < (int)uVar2);
  uVar5 = -(uint)((int)uVar2 < (int)uVar7);
  uVar2 = ~uVar5 & uVar2 | uVar7 & uVar5;
  uVar5 = (cpi->oxcf).max_threads;
  if ((int)uVar2 < (int)uVar5) {
    uVar5 = uVar2;
  }
  return uVar5;
}

Assistant:

int av1_get_max_num_workers(const AV1_COMP *cpi) {
  int max_num_workers = 0;
  for (int i = MOD_FP; i < NUM_MT_MODULES; i++)
    max_num_workers =
        AOMMAX(cpi->ppi->p_mt_info.num_mod_workers[i], max_num_workers);
  assert(max_num_workers >= 1);
  return AOMMIN(max_num_workers, cpi->oxcf.max_threads);
}